

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O0

void __thiscall
MarkdownHighlighter::highlightFrontmatterBlock(MarkdownHighlighter *this,QString *text)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  bool local_71;
  HighlighterState local_60 [2];
  QTextCharFormat *local_58;
  QTextCharFormat *maskedFormat;
  QTextBlock local_40;
  undefined1 local_29;
  undefined1 auStack_28 [7];
  bool foundEnd;
  QString *local_18;
  QString *text_local;
  MarkdownHighlighter *this_local;
  
  local_18 = text;
  text_local = (QString *)this;
  QLatin1String::QLatin1String((QLatin1String *)auStack_28,"---");
  bVar1 = ::operator==(text,_auStack_28);
  iVar4 = (int)this;
  if (bVar1) {
    iVar2 = QSyntaxHighlighter::previousBlockState();
    local_29 = iVar2 == 0x1b;
    local_71 = false;
    if (!(bool)local_29) {
      QSyntaxHighlighter::document();
      QTextDocument::firstBlock();
      QSyntaxHighlighter::currentBlock();
      local_71 = QTextBlock::operator!=(&local_40,(QTextBlock *)&maskedFormat);
    }
    if (local_71 == false) {
      QSyntaxHighlighter::setCurrentBlockState(iVar4);
      local_60[1] = 0x18;
      local_58 = QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                           (&_formats,local_60 + 1);
      uVar3 = QString::length(local_18);
      QSyntaxHighlighter::setFormat(iVar4,0,(QTextCharFormat *)(uVar3 & 0xffffffff));
    }
  }
  else {
    iVar2 = QSyntaxHighlighter::previousBlockState();
    if (iVar2 == 0x1b) {
      QSyntaxHighlighter::setCurrentBlockState(iVar4);
      uVar3 = QString::length(local_18);
      local_60[0] = MaskedSyntax;
      QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[](&_formats,local_60);
      QSyntaxHighlighter::setFormat(iVar4,0,(QTextCharFormat *)(uVar3 & 0xffffffff));
    }
  }
  return;
}

Assistant:

void MarkdownHighlighter::highlightFrontmatterBlock(const QString &text) {
    if (text == QLatin1String("---")) {
        const bool foundEnd =
            previousBlockState() == HighlighterState::FrontmatterBlock;

        // return if the frontmatter block was already highlighted in previous
        // blocks, there just can be one frontmatter block
        if (!foundEnd && document()->firstBlock() != currentBlock()) {
            return;
        }

        setCurrentBlockState(foundEnd ? HighlighterState::FrontmatterBlockEnd
                                      : HighlighterState::FrontmatterBlock);

        QTextCharFormat &maskedFormat =
            _formats[HighlighterState::MaskedSyntax];
        setFormat(0, text.length(), maskedFormat);
    } else if (previousBlockState() == HighlighterState::FrontmatterBlock) {
        setCurrentBlockState(HighlighterState::FrontmatterBlock);
        setFormat(0, text.length(), _formats[HighlighterState::MaskedSyntax]);
    }
}